

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9CFraig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *pcVar1;
  Ssc_Pars_t *pPars;
  Ssc_Pars_t Pars;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Ssc_ManSetDefaultParams((Ssc_Pars_t *)&pPars);
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      Pars.fVerbose = Extra_UtilGetopt(argc,argv,"WCacvh");
      if (Pars.fVerbose == -1) {
        if (pAbc->pGia == (Gia_Man_t *)0x0) {
          Abc_Print(-1,"Abc_CommandAbc9CFraig(): There is no AIG.\n");
          return 1;
        }
        register0x00000000 = Ssc_PerformSweepingConstr(pAbc->pGia,(Ssc_Pars_t *)&pPars);
        Abc_FrameUpdateGia(pAbc,register0x00000000);
        return 0;
      }
      if (Pars.fVerbose == 0x43) break;
      if (Pars.fVerbose == 0x57) {
        if (argc <= globalUtilOptind) {
          Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
          goto LAB_002ac41d;
        }
        pPars._0_4_ = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if ((int)(uint)pPars < 0) goto LAB_002ac41d;
      }
      else if (Pars.fVerbose == 0x61) {
        Pars.nSatVarMax = Pars.nSatVarMax ^ 1;
      }
      else if (Pars.fVerbose == 99) {
        Pars.fAppend = Pars.fAppend ^ 1;
      }
      else {
        if (Pars.fVerbose != 0x76) goto LAB_002ac41d;
        Pars.nCallsRecycle = Pars.nCallsRecycle ^ 1;
      }
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    pPars._4_4_ = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < (int)pPars._4_4_);
LAB_002ac41d:
  Abc_Print(-2,"usage: &cfraig [-WC <num>] [-acvh]\n");
  Abc_Print(-2,"\t         performs combinational SAT sweeping under constraints\n");
  Abc_Print(-2,"\t         which are present in the AIG or set manually using \"constr\"\n");
  Abc_Print(-2,"\t         (constraints are listed as last POs and true when they are 0)\n");
  Abc_Print(-2,"\t-W num : the number of simulation words [default = %d]\n",(ulong)(uint)pPars);
  Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
            (ulong)pPars._4_4_);
  pcVar1 = "no";
  if (Pars.nSatVarMax != 0) {
    pcVar1 = "yes";
  }
  Abc_Print(-2,"\t-a     : toggle appending constraints to the result [default = %s]\n",pcVar1);
  pcVar1 = "no";
  if (Pars.fAppend != 0) {
    pcVar1 = "yes";
  }
  Abc_Print(-2,"\t-c     : toggle performing internal verification [default = %s]\n",pcVar1);
  pcVar1 = "no";
  if (Pars.nCallsRecycle != 0) {
    pcVar1 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar1);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9CFraig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c;
    Ssc_Pars_t Pars, * pPars = &Pars;
    Ssc_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WCacvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAppend ^= 1;
            break;
        case 'c':
            pPars->fVerify ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9CFraig(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Ssc_PerformSweepingConstr( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &cfraig [-WC <num>] [-acvh]\n" );
    Abc_Print( -2, "\t         performs combinational SAT sweeping under constraints\n" );
    Abc_Print( -2, "\t         which are present in the AIG or set manually using \"constr\"\n" );
    Abc_Print( -2, "\t         (constraints are listed as last POs and true when they are 0)\n" );
    Abc_Print( -2, "\t-W num : the number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-a     : toggle appending constraints to the result [default = %s]\n", pPars->fAppend? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle performing internal verification [default = %s]\n", pPars->fVerify? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}